

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableValue.cpp
# Opt level: O2

void __thiscall VariableValue::SetValue(VariableValue *this,Value *object)

{
  __type _Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  runtime_error *this_00;
  _Hashtable<Symbol,_std::pair<const_Symbol,_Value_*>,_std::allocator<std::pair<const_Symbol,_Value_*>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar2 = (*object->_vptr_Value[3])(object);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar2))
            (&local_80,(undefined8 *)CONCAT44(extraout_var,iVar2));
  iVar2 = (*(this->super_Value)._vptr_Value[3])(this);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var_00,iVar2))
            (&local_48,(undefined8 *)CONCAT44(extraout_var_00,iVar2));
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_80,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_80);
  if (_Var1) {
    iVar2 = (*object->_vptr_Value[3])(object);
    this->type_ = (PrimitiveSimpleObject *)CONCAT44(extraout_var_01,iVar2);
    iVar2 = (*object->_vptr_Value[2])(object);
    this->value_ = iVar2;
    (*object->_vptr_Value[4])(&local_80,object);
    std::
    _Hashtable<Symbol,_std::pair<const_Symbol,_Value_*>,_std::allocator<std::pair<const_Symbol,_Value_*>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::operator=(&(this->fields_)._M_h,&local_80);
    std::
    _Hashtable<Symbol,_std::pair<const_Symbol,_Value_*>,_std::allocator<std::pair<const_Symbol,_Value_*>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_80);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Different types");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VariableValue::SetValue(Value* object) {
  if (object->GetType()->GetTypename() == this->GetType()->GetTypename()) {
    type_ = (PrimitiveSimpleObject*)object->GetType();
  } else {
    throw std::runtime_error("Different types");
  }
  value_ = object->GetValue();
  fields_ = std::move(object->GetFields());
}